

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdGetPsbtPubkeyListData
              (void *handle,void *pubkey_list_handle,uint32_t index,char **pubkey,char **pubkey_hex)

{
  pointer *ppuVar1;
  long *plVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  CfdException *pCVar6;
  ulong uVar7;
  char *work_pubkey;
  Pubkey pubkey_obj;
  ExtPubkey extkey;
  value_type key;
  string local_230;
  undefined8 local_210;
  ByteData local_208;
  ExtPubkey local_1f0;
  KeyData local_180;
  
  local_210 = 0;
  cfd::Initialize();
  ppuVar1 = (pointer *)
            ((long)&local_180.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 0x10
            );
  local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"PsbtPubkeyList","");
  cfd::capi::CheckBuffer(pubkey_list_handle,(string *)&local_180);
  if ((pointer *)
      local_180.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_180.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (pubkey == (char **)0x0) {
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x728;
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyListData";
    cfd::core::logger::log<>((CfdSourceLocation *)&local_180,kCfdLogLevelWarning,"pubkey is null.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"Failed to parameter. pubkey is null.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_180);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  plVar2 = *(long **)((long)pubkey_list_handle + 0x18);
  if (plVar2 == (long *)0x0) {
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x72e;
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyListData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_180,kCfdLogLevelWarning,"key_list is null.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"Failed to handle statement. key_list is null.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)&local_180);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar3 = (ulong)index;
  uVar7 = (plVar2[1] - *plVar2 >> 4) * -0x30c30c30c30c30c3;
  if (uVar7 < uVar3 || uVar7 - uVar3 == 0) {
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x734;
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyListData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_180,kCfdLogLevelWarning,"out of range error.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"Failed to out of range.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdOutOfRangeError,(string *)&local_180);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::KeyData::KeyData(&local_180,(KeyData *)(*plVar2 + uVar3 * 0x150));
  if (*(char *)((long)pubkey_list_handle + 0x11) == '\x01') {
    cfd::core::KeyData::GetExtPubkey(&local_1f0,&local_180);
    cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_230,&local_1f0);
    pcVar4 = cfd::capi::CreateString(&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if (pubkey_hex == (char **)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      cfd::core::ExtPubkey::GetData(&local_208,&local_1f0);
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_230,&local_208);
      pcVar5 = cfd::capi::CreateString(&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      if (local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (local_1f0.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.tweak_sum_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1f0.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_230._M_dataplus._M_p =
         (pointer)local_1f0.serialize_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (local_1f0.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.chaincode_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      local_230._M_dataplus._M_p =
           (pointer)local_1f0.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
  }
  else {
    cfd::core::KeyData::GetPubkey((Pubkey *)&local_230,&local_180);
    cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&local_1f0,(Pubkey *)&local_230);
    pcVar4 = cfd::capi::CreateString((string *)&local_1f0);
    ppuVar1 = (pointer *)
              ((long)&local_1f0.serialize_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + 0x10);
    if ((pointer *)
        local_1f0.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != ppuVar1) {
      operator_delete(local_1f0.serialize_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (pubkey_hex == (char **)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&local_1f0,(Pubkey *)&local_230);
      pcVar5 = cfd::capi::CreateString((string *)&local_1f0);
      if ((pointer *)
          local_1f0.serialize_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != ppuVar1) {
        operator_delete(local_1f0.serialize_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  if ((pointer)local_230._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  *pubkey = pcVar4;
  if (pubkey_hex != (char **)0x0) {
    *pubkey_hex = pcVar5;
  }
  cfd::core::KeyData::~KeyData(&local_180);
  return 0;
}

Assistant:

int CfdGetPsbtPubkeyListData(
    void* handle, void* pubkey_list_handle, uint32_t index, char** pubkey,
    char** pubkey_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_pubkey = nullptr;
  char* work_pubkey_hex = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(pubkey_list_handle, kPrefixPsbtPubkeyList);
    CfdCapiPsbtPubkeyListHandle* list_handle =
        static_cast<CfdCapiPsbtPubkeyListHandle*>(pubkey_list_handle);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (list_handle->key_list == nullptr) {
      warn(CFD_LOG_SOURCE, "key_list is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. key_list is null.");
    }
    if (index >= list_handle->key_list->size()) {
      warn(CFD_LOG_SOURCE, "out of range error.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "Failed to out of range.");
    }

    auto key = list_handle->key_list->at(index);
    if (list_handle->has_xpub_list) {
      auto extkey = key.GetExtPubkey();
      work_pubkey = CreateString(extkey.ToString());
      if (pubkey_hex != nullptr) {
        work_pubkey_hex = CreateString(extkey.GetData().GetHex());
      }
    } else {
      auto pubkey_obj = key.GetPubkey();
      work_pubkey = CreateString(pubkey_obj.GetHex());
      if (pubkey_hex != nullptr) {
        work_pubkey_hex = CreateString(pubkey_obj.GetHex());
      }
    }

    *pubkey = work_pubkey;
    if (pubkey_hex != nullptr) *pubkey_hex = work_pubkey_hex;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_pubkey, &work_pubkey_hex);
  return result;
}